

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grparser.c
# Opt level: O2

int fits_execute_template(fitsfile *ff,char *ngp_template,int *status)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  size_t sVar6;
  ulong uVar7;
  int my_hn;
  int tmp0;
  int more_keys;
  int keys_exist;
  char grnm [80];
  
  if (status == (int *)0x0) {
    iVar3 = 0x16a;
  }
  else {
    iVar3 = *status;
    if (iVar3 == 0) {
      iVar3 = 0x16a;
      if (ngp_template != (char *)0x0 && ff != (fitsfile *)0x0) {
        ngp_inclevel = 0;
        ngp_grplevel = 0;
        master_grp_idx = 1;
        ngp_master_dir[0] = '\0';
        iVar3 = ngp_delete_extver_tab();
        if (iVar3 == 0) {
          ffghdn(ff,&my_hn);
          if (my_hn < 2) {
            ffmahd(ff,1,&tmp0,status);
            ffghsp(ff,&keys_exist,&more_keys,status);
            ffmahd(ff,my_hn,&tmp0,status);
            if (*status != 0) {
              return *status;
            }
            bVar1 = 0 < keys_exist;
          }
          else {
            for (iVar3 = 2; iVar3 <= my_hn; iVar3 = iVar3 + 1) {
              *status = 0;
              ffmahd(ff,1,&tmp0,status);
              if (*status != 0) break;
              ffgky(ff,0x10,"EXTNAME",&keys_exist,(char *)0x0,status);
              if (*status == 0) {
                ffgky(ff,0x29,"EXTVER",&more_keys,(char *)0x0,status);
                iVar4 = more_keys;
                if (*status != 0) {
                  if (*status != 0xcc) goto LAB_001b4da5;
                  *status = 0;
                  iVar4 = 1;
                }
                iVar4 = ngp_set_extver((char *)&keys_exist,iVar4);
                *status = iVar4;
              }
LAB_001b4da5:
            }
            ffmahd(ff,my_hn,&tmp0,status);
            if (*status != 0) {
              return *status;
            }
            bVar1 = true;
          }
          iVar3 = ngp_include_file(ngp_template);
          *status = iVar3;
          if (iVar3 != 0) {
            return iVar3;
          }
          sVar6 = strlen(ngp_template);
          uVar7 = sVar6 & 0xffffffff;
          uVar5 = (int)sVar6 + 1;
          do {
            uVar7 = uVar7 - 1;
            if ((int)(uint)uVar7 < 0) goto LAB_001b4e45;
            uVar5 = uVar5 - 1;
          } while (ngp_template[(uint)uVar7 & 0x7fffffff] != '/');
          if (0 < (int)uVar5) {
            uVar2 = 999;
            if (uVar5 < 999) {
              uVar2 = uVar5;
            }
            memcpy(ngp_master_dir,ngp_template,(ulong)uVar2);
            ngp_master_dir[uVar2] = '\0';
          }
LAB_001b4e45:
          do {
            iVar3 = ngp_read_line(1);
            if (iVar3 != 0) break;
            iVar3 = 0x171;
            switch(ngp_keyidx) {
            case 1:
              if (ngp_linkey.type == 2) {
                strncpy(grnm,ngp_linkey.value.s,0x50);
              }
              else {
                master_grp_idx = master_grp_idx + 1;
                snprintf(grnm,0x50,"DEFAULT_GROUP_%d");
              }
              grnm[0x4f] = '\0';
              iVar3 = ngp_read_group(ff,grnm,0);
              goto LAB_001b4f10;
            default:
              goto switchD_001b4e76_caseD_2;
            case 3:
              iVar3 = ngp_unread_line();
              if (iVar3 != 0) goto switchD_001b4e76_caseD_2;
              iVar3 = (uint)(byte)~bVar1 * 2;
              break;
            case 4:
              if ((bVar1) || (iVar3 = ngp_unread_line(), iVar3 != 0)) goto switchD_001b4e76_caseD_2;
              iVar3 = 3;
              break;
            case 5:
              iVar3 = 0;
              goto switchD_001b4e76_caseD_2;
            }
            iVar3 = ngp_read_xtension(ff,0,iVar3);
LAB_001b4f10:
            bVar1 = true;
          } while (iVar3 == 0);
switchD_001b4e76_caseD_2:
          ngp_free_line();
          ngp_free_prevline();
          ngp_delete_extver_tab();
        }
      }
      *status = iVar3;
    }
  }
  return iVar3;
}

Assistant:

int	fits_execute_template(fitsfile *ff, char *ngp_template, int *status)
 { int		r, exit_flg, first_extension, i, my_hn, tmp0, keys_exist, more_keys, used_ver;
   char		grnm[NGP_MAX_STRING], used_name[NGP_MAX_STRING];
   long		luv;

   if (NULL == status) return(NGP_NUL_PTR);
   if (NGP_OK != *status) return(*status);

   /* This function uses many global variables (local to this file) and
      therefore is not thread-safe. */
   FFLOCK;
   
   if ((NULL == ff) || (NULL == ngp_template))
     { *status = NGP_NUL_PTR;
       FFUNLOCK;
       return(*status);
     }

   ngp_inclevel = 0;				/* initialize things, not all should be zero */
   ngp_grplevel = 0;
   master_grp_idx = 1;
   exit_flg = 0;
   ngp_master_dir[0] = 0;			/* this should be before 1st call to ngp_include_file */
   first_extension = 1;				/* we need to create PHDU */

   if (NGP_OK != (r = ngp_delete_extver_tab()))
     { *status = r;
       FFUNLOCK;
       return(r);
     }

   fits_get_hdu_num(ff, &my_hn);		/* our HDU position */
   if (my_hn <= 1)				/* check whether we really need to create PHDU */
     { fits_movabs_hdu(ff, 1, &tmp0, status);
       fits_get_hdrspace(ff, &keys_exist, &more_keys, status);
       fits_movabs_hdu(ff, my_hn, &tmp0, status);
       if (NGP_OK != *status) /* error here means file is corrupted */
       {
          FFUNLOCK;
          return(*status);	
       }
       if (keys_exist > 0) first_extension = 0;	/* if keywords exist assume PHDU already exist */
     }
   else
     { first_extension = 0;			/* PHDU (followed by 1+ extensions) exist */

       for (i = 2; i<= my_hn; i++)
        { *status = NGP_OK;
          fits_movabs_hdu(ff, 1, &tmp0, status);
          if (NGP_OK != *status) break;

          fits_read_key(ff, TSTRING, "EXTNAME", used_name, NULL, status);
          if (NGP_OK != *status)  continue;

          fits_read_key(ff, TLONG, "EXTVER", &luv, NULL, status);
          used_ver = luv;			/* bugfix - 22-Jan-99, BO - nonalignment of OSF/Alpha */
          if (VALUE_UNDEFINED == *status)
            { used_ver = 1;
              *status = NGP_OK;
            }

          if (NGP_OK == *status) *status = ngp_set_extver(used_name, used_ver);
        }

       fits_movabs_hdu(ff, my_hn, &tmp0, status);
     }
     
   if (NGP_OK != *status) {
      FFUNLOCK;
      return(*status);
   }                                                                       
   if (NGP_OK != (*status = ngp_include_file(ngp_template))) {
      FFUNLOCK;
      return(*status);
   }
   
   for (i = strlen(ngp_template) - 1; i >= 0; i--) /* strlen is > 0, otherwise fopen failed */
    { 
#ifdef MSDOS
      if ('\\' == ngp_template[i]) break;
#else
      if ('/' == ngp_template[i]) break;
#endif
    } 
      
   i++;
   if (i > (NGP_MAX_FNAME - 1)) i = NGP_MAX_FNAME - 1;

   if (i > 0)
     { memcpy(ngp_master_dir, ngp_template, i);
       ngp_master_dir[i] = 0;
     }


   for (;;)
    { if (NGP_OK != (r = ngp_read_line(1))) break;	/* EOF always means error here */
      switch (ngp_keyidx)
       {
         case NGP_TOKEN_SIMPLE:
			if (0 == first_extension)	/* simple only allowed in first HDU */
			  { r = NGP_TOKEN_NOT_EXPECT;
			    break;
			  }
			if (NGP_OK != (r = ngp_unread_line())) break;
			r = ngp_read_xtension(ff, 0, NGP_XTENSION_SIMPLE | NGP_XTENSION_FIRST);
			first_extension = 0;
			break;

         case NGP_TOKEN_XTENSION:
			if (NGP_OK != (r = ngp_unread_line())) break;
			r = ngp_read_xtension(ff, 0, (first_extension ? NGP_XTENSION_FIRST : 0));
			first_extension = 0;
			break;

         case NGP_TOKEN_GROUP:
			if (NGP_TTYPE_STRING == ngp_linkey.type)
			  { strncpy(grnm, ngp_linkey.value.s, NGP_MAX_STRING); }
			else
			  { snprintf(grnm,NGP_MAX_STRING, "DEFAULT_GROUP_%d", master_grp_idx++); }
			grnm[NGP_MAX_STRING - 1] = 0;
			r = ngp_read_group(ff, grnm, 0);
			first_extension = 0;
			break;

	 case NGP_TOKEN_EOF:
			exit_flg = 1;
			break;

         default:	r = NGP_TOKEN_NOT_EXPECT;
			break;
       }
      if (exit_flg || (NGP_OK != r)) break;
    }

/* all top level HDUs up to faulty one are left intact in case of i/o error. It is up
   to the caller to call fits_close_file or fits_delete_file when this function returns
   error. */

   ngp_free_line();		/* deallocate last line (if any) */
   ngp_free_prevline();		/* deallocate cached line (if any) */
   ngp_delete_extver_tab();	/* delete extver table (if present), error ignored */
   
   *status = r;
   FFUNLOCK;
   return(r);
 }